

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O3

void __thiscall Container::slave(Container *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  int iVar3;
  Worker *this_00;
  SharedBarrier *this_01;
  char *pcVar4;
  ContextManager *pCVar5;
  long lVar6;
  string *name;
  TaskData *pTVar7;
  string local_50;
  
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"slave","");
  name = &local_50;
  ContextManager::set(&this->super_ContextManager,name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    name = (string *)(local_50.field_2._M_allocated_capacity + 1);
    operator_delete(local_50._M_dataplus._M_p,(ulong)name);
  }
  reset_sigchld();
  this_00 = Worker::get();
  this_01 = Worker::get_run_start_barrier(this_00);
  SharedBarrier::wait(this_01,name);
  ((this->task_data_).ptr_)->error = false;
  CgroupController::delay_enter(this->memory_controller_);
  CgroupController::delay_enter(this->cpuacct_controller_);
  iVar3 = chdir((this->work_dir_)._M_pathname._M_dataplus._M_p);
  if (iVar3 != 0) {
    pCVar5 = ContextManager::get();
    format_abi_cxx11_(&local_50,"chdir() failed: %m");
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = chroot((this->root_)._M_pathname._M_dataplus._M_p);
  if (iVar3 != 0) {
    pCVar5 = ContextManager::get();
    format_abi_cxx11_(&local_50,"chroot() failed: %m");
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  open_files(this);
  dup2_fds(this);
  close_all_fds(this);
  setup_rlimits(this);
  setup_credentials(this);
  CgroupController::enter(this->memory_controller_);
  CgroupController::enter(this->cpuacct_controller_);
  pTVar7 = (this->task_data_).ptr_;
  sVar2 = (pTVar7->env).items_.size_;
  if (sVar2 != 1) {
    lVar6 = 0;
    do {
      iVar3 = strcmp(*(char **)((pTVar7->env).items_.data_ + lVar6 * 8),"PATH=");
      if (iVar3 == 0) goto LAB_00118646;
      lVar6 = lVar6 + 1;
    } while (sVar2 - 1 != lVar6);
  }
  pcVar4 = getenv("PATH");
  if (pcVar4 != (char *)0x0) {
    format_abi_cxx11_(&local_50,"PATH=%s",pcVar4);
    PlainStringVector<129UL,_5120UL>::add(&pTVar7->env,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pTVar7 = (this->task_data_).ptr_;
  }
LAB_00118646:
  execvpe(*(char **)(pTVar7->argv).items_.data_,(char **)(pTVar7->argv).items_.data_,
          (char **)(pTVar7->env).items_.data_);
  pCVar5 = ContextManager::get();
  format_abi_cxx11_(&local_50,"Failed to execute command \'%s\': %m",
                    *(undefined8 *)(((this->task_data_).ptr_)->argv).items_.data_);
  (**pCVar5->_vptr_ContextManager)(pCVar5,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  _exit(-1);
}

Assistant:

void Container::slave() {
    ContextManager::set(this, "slave");
    reset_sigchld();

    Worker::get().get_run_start_barrier()->wait();
    task_data_->error = false;

    memory_controller_->delay_enter();
    cpuacct_controller_->delay_enter();

    if (chdir(work_dir_.c_str()) != 0) {
        die(format("chdir() failed: %m"));
    }

    if (chroot(root_.c_str()) != 0) {
        die(format("chroot() failed: %m"));
    }

    open_files();
    dup2_fds();
    close_all_fds();
    setup_rlimits();
    setup_credentials();

    memory_controller_->enter();
    cpuacct_controller_->enter();

    bool has_path = false;
    for (size_t i = 0; i < task_data_->env.count(); ++i) {
        if (strcmp(task_data_->env[i], "PATH=") == 0) {
            has_path = true;
            break;
        }
    }
    if (!has_path) {
        char *path_env = getenv("PATH");
        if (path_env != nullptr) {
            task_data_->env.add(format("PATH=%s", path_env));
        }
    }

    execvpe(task_data_->argv[0], task_data_->argv.get(), task_data_->env.get());
    die(format("Failed to execute command '%s': %m", task_data_->argv[0]));
    _exit(-1); // we should not get here
}